

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avs2d_dpb.c
# Opt level: O2

MPP_RET dpb_remove_frame(Avs2dCtx_t *p_dec,Avs2dFrame_t *p)

{
  RK_U32 *pRVar1;
  MppFrame pvVar2;
  MPP_RET MVar3;
  MPP_RET extraout_EAX;
  ulong uVar4;
  MppBuffer buffer;
  
  pvVar2 = p->frame;
  if (((byte)avs2d_parse_debug & 0x40) != 0) {
    _mpp_log_l(4,"avs2d_dpb","In.","dpb_remove_frame");
  }
  if ((p->picture_type == GB_PICTURE) || (p->invisible != '\0')) {
    buffer = (MppBuffer)0x0;
    mpp_buf_slot_get_prop(p_dec->frame_slots,p->slot_idx,SLOT_BUFFER,&buffer);
    mpp_buffer_put_with_caller(buffer,"dpb_remove_frame");
  }
  MVar3 = mpp_buf_slot_clr_flag(p_dec->frame_slots,p->slot_idx,SLOT_CODEC_USE);
  if (((byte)avs2d_parse_debug & 0x40) != 0) {
    uVar4 = (ulong)(uint)p->poi;
    _mpp_log_l(4,"avs2d_dpb","dpb remove frame slot_idx %d, doi %d poi %d, dpb used %d",
               "dpb_remove_frame",(ulong)(uint)p->slot_idx,(ulong)(uint)p->doi,uVar4,
               (ulong)(p_dec->frm_mgr).used_size);
    MVar3 = (MPP_RET)uVar4;
  }
  p->frame_mode = 0;
  p->frame_coding_mode = 0;
  p->picture_type = I_PICTURE;
  p->slot_idx = 0;
  p->doi = 0;
  p->poi = 0;
  p->out_delay = 0;
  p->invisible = '\0';
  p->scene_frame_flag = '\0';
  p->intra_frame_flag = '\0';
  p->refered_bg_frame = '\0';
  p->refered_by_others = '\0';
  p->refered_by_scene = '\0';
  p->error_flag = '\0';
  p->is_output = '\0';
  *(undefined4 *)&p->field_0x2c = 0;
  p->frame = pvVar2;
  p->slot_idx = -1;
  p->doi = -1;
  p->poi = -1;
  pRVar1 = &(p_dec->frm_mgr).used_size;
  *pRVar1 = *pRVar1 - 1;
  if (((byte)avs2d_parse_debug & 0x40) != 0) {
    _mpp_log_l(4,"avs2d_dpb","Out.","dpb_remove_frame");
    MVar3 = extraout_EAX;
  }
  return MVar3;
}

Assistant:

static MPP_RET dpb_remove_frame(Avs2dCtx_t *p_dec, Avs2dFrame_t *p)
{
    Avs2dFrameMgr_t *mgr = &p_dec->frm_mgr;
    MppFrame frame = p->frame;

    avs2d_dbg_dpb("In.");

    if (p->picture_type == GB_PICTURE || p->invisible) {
        MppBuffer buffer = NULL;
        mpp_buf_slot_get_prop(p_dec->frame_slots, p->slot_idx, SLOT_BUFFER, &buffer);
        mpp_buffer_put(buffer);
    }

    mpp_buf_slot_clr_flag(p_dec->frame_slots, p->slot_idx, SLOT_CODEC_USE);
    avs2d_dbg_dpb("dpb remove frame slot_idx %d, doi %d poi %d, dpb used %d",
                  p->slot_idx, p->doi, p->poi, mgr->used_size);

    memset(p, 0, sizeof(Avs2dFrame_t));
    p->frame = frame;
    p->slot_idx = NO_VAL;
    p->doi = NO_VAL;
    p->poi = NO_VAL;
    mgr->used_size--;

    avs2d_dbg_dpb("Out.");
    return MPP_OK;
}